

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

UEnumeration *
ucol_getKeywordValuesForLocale_63(char *param_1,char *locale,UBool param_3,UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *pUVar2;
  UEnumeration *en;
  undefined1 local_50 [8];
  KeywordsSink sink;
  LocalUResourceBundlePointer bundle;
  UErrorCode *status_local;
  UBool param_2_local;
  char *locale_local;
  char *param_0_local;
  
  pUVar2 = ures_open_63("icudt63l-coll",locale,status);
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&sink.hasDefault,pUVar2);
  anon_unknown.dwarf_ae428::KeywordsSink::KeywordsSink((KeywordsSink *)local_50,status);
  pUVar2 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                     ((LocalPointerBase<UResourceBundle> *)&sink.hasDefault);
  ures_getAllItemsWithFallback_63(pUVar2,"collations",(ResourceSink *)local_50,status);
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    param_0_local = (char *)uprv_malloc_63(0x38);
    if (param_0_local == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      param_0_local = (char *)0x0;
    }
    else {
      *(code **)(param_0_local + 0x30) = ulist_reset_keyword_values_iterator_63;
      *(code **)(param_0_local + 0x20) = uenum_unextDefault_63;
      *(code **)(param_0_local + 0x28) = ulist_next_keyword_value_63;
      *(code **)(param_0_local + 0x10) = ulist_close_keyword_values_iterator_63;
      *(code **)(param_0_local + 0x18) = ulist_count_keyword_values_63;
      *(void **)param_0_local = (void *)0x0;
      *(void **)(param_0_local + 8) = (void *)0x0;
      ulist_resetList_63((UList *)sink.super_ResourceSink.super_UObject._vptr_UObject);
      ((UObject *)(param_0_local + 8))->_vptr_UObject =
           (_func_int **)sink.super_ResourceSink.super_UObject._vptr_UObject;
      sink.super_ResourceSink.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
    }
  }
  else {
    param_0_local = (char *)0x0;
  }
  anon_unknown.dwarf_ae428::KeywordsSink::~KeywordsSink((KeywordsSink *)local_50);
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&sink.hasDefault);
  return (UEnumeration *)param_0_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucol_getKeywordValuesForLocale(const char* /*key*/, const char* locale,
                               UBool /*commonlyUsed*/, UErrorCode* status) {
    // Note: The parameter commonlyUsed is not used.
    // The switch is in the method signature for consistency
    // with other locale services.

    // Read available collation values from collation bundles.
    LocalUResourceBundlePointer bundle(ures_open(U_ICUDATA_COLL, locale, status));
    KeywordsSink sink(*status);
    ures_getAllItemsWithFallback(bundle.getAlias(), RESOURCE_NAME, sink, *status);
    if (U_FAILURE(*status)) { return NULL; }

    UEnumeration *en = (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if (en == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    ulist_resetList(sink.values);  // Initialize the iterator.
    en->context = sink.values;
    sink.values = NULL;  // Avoid deletion in the sink destructor.
    return en;
}